

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  bool bVar1;
  Value *this_00;
  Value local_68;
  undefined4 local_50;
  undefined1 local_40 [8];
  string decoded;
  Token *token_local;
  Reader *this_local;
  
  decoded.field_2._8_8_ = token;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = decodeString(this,(Token *)decoded.field_2._8_8_,(string *)local_40);
  if (bVar1) {
    Value::Value(&local_68,(string *)local_40);
    this_00 = currentValue(this);
    Value::operator=(this_00,&local_68);
    Value::~Value(&local_68);
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool 
Reader::decodeString( Token &token )
{
   std::string decoded;
   if ( !decodeString( token, decoded ) )
      return false;
   currentValue() = decoded;
   return true;
}